

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O3

int __thiscall TCPConnection::ReadLine(TCPConnection *this,char *buffer,int size)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  
  iVar2 = -1;
  do {
    pcVar3 = buffer;
    iVar1 = Read(this);
    if (iVar1 == 0xd) {
      iVar1 = 0;
    }
    else if ((char)iVar1 == '\n') {
      *pcVar3 = '\0';
      size = -iVar2;
      break;
    }
    *pcVar3 = (char)iVar1;
    iVar1 = size + iVar2;
    iVar2 = iVar2 + -1;
    buffer = pcVar3 + 1;
  } while (iVar1 != 0);
  pcVar3[1] = '\0';
  return size;
}

Assistant:

int TCPConnection::ReadLine(char* buffer, int size)
{
    int i;
    char c;
    bool done = false;
    int bytesProcessed = 0;

    while (!done)
    {
        i = Read();
        if (i == -1)
        {
            *buffer = 0;
            break;
        }
        c = (char)i;
        bytesProcessed++;
        switch (c)
        {
        case '\r': *buffer++ = 0; break;
        case '\n':
            *buffer++ = 0;
            done = true;
            break;
        default: *buffer++ = c; break;
        }

        if (bytesProcessed == size)
        {
            break;
        }
    }

    *buffer = 0;
    return bytesProcessed;
}